

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  BYTE *tableBase;
  long lVar1;
  int in_EDX;
  BYTE *in_RSI;
  long in_RDI;
  BYTE *base;
  BYTE *dictEnd;
  BYTE *p;
  LZ4_stream_t_internal *dict;
  BYTE *in_stack_ffffffffffffffb8;
  int local_4;
  
  tableBase = in_RSI + in_EDX;
  if ((*(int *)(in_RDI + 0x4004) != 0) || (0x40000000 < *(uint *)(in_RDI + 0x4000))) {
    LZ4_resetStream((LZ4_stream_t *)0x17b611);
  }
  if (in_EDX < 8) {
    *(undefined8 *)(in_RDI + 0x4008) = 0;
    *(undefined4 *)(in_RDI + 0x4018) = 0;
    local_4 = 0;
  }
  else {
    if (0x10000 < (long)tableBase - (long)in_RSI) {
      in_RSI = tableBase + -0x10000;
    }
    *(int *)(in_RDI + 0x4000) = *(int *)(in_RDI + 0x4000) + 0x10000;
    lVar1 = (long)in_RSI - (ulong)*(uint *)(in_RDI + 0x4000);
    *(BYTE **)(in_RDI + 0x4008) = in_RSI;
    *(int *)(in_RDI + 0x4018) = (int)tableBase - (int)in_RSI;
    *(int *)(in_RDI + 0x4000) = *(int *)(in_RDI + 0x4018) + *(int *)(in_RDI + 0x4000);
    for (; in_RSI <= tableBase + -8; in_RSI = in_RSI + 3) {
      LZ4_putPosition(in_RSI,tableBase,(tableType_t)((ulong)lVar1 >> 0x20),in_stack_ffffffffffffffb8
                     );
    }
    local_4 = *(int *)(in_RDI + 0x4018);
  }
  return local_4;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = (LZ4_stream_t_internal*) LZ4_dict;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    if ((dict->initCheck) || (dict->currentOffset > 1 GB))  /* Uninitialized structure, or reuse overflow */
        LZ4_resetStream(LZ4_dict);

    if (dictSize < (int)HASH_UNIT)
    {
        dict->dictionary = NULL;
        dict->dictSize = 0;
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    dict->currentOffset += 64 KB;
    base = p - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->currentOffset += dict->dictSize;

    while (p <= dictEnd-HASH_UNIT)
    {
        LZ4_putPosition(p, dict->hashTable, byU32, base);
        p+=3;
    }

    return dict->dictSize;
}